

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O0

UConverterType ucnv_MBCSGetType_63(UConverter *converter)

{
  UConverter *converter_local;
  
  if ((converter->sharedData->mbcs).countStates == '\x01') {
    converter_local._4_4_ = UCNV_SBCS;
  }
  else if ((converter->sharedData->mbcs).outputType == '\f') {
    converter_local._4_4_ = UCNV_EBCDIC_STATEFUL;
  }
  else if ((converter->sharedData->staticData->minBytesPerChar == '\x02') &&
          (converter->sharedData->staticData->maxBytesPerChar == '\x02')) {
    converter_local._4_4_ = UCNV_DBCS;
  }
  else {
    converter_local._4_4_ = UCNV_MBCS;
  }
  return converter_local._4_4_;
}

Assistant:

U_CFUNC UConverterType
ucnv_MBCSGetType(const UConverter* converter) {
    /* SBCS, DBCS, and EBCDIC_STATEFUL are replaced by MBCS, but here we cheat a little */
    if(converter->sharedData->mbcs.countStates==1) {
        return (UConverterType)UCNV_SBCS;
    } else if((converter->sharedData->mbcs.outputType&0xff)==MBCS_OUTPUT_2_SISO) {
        return (UConverterType)UCNV_EBCDIC_STATEFUL;
    } else if(converter->sharedData->staticData->minBytesPerChar==2 && converter->sharedData->staticData->maxBytesPerChar==2) {
        return (UConverterType)UCNV_DBCS;
    }
    return (UConverterType)UCNV_MBCS;
}